

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastIntrinsics.h
# Opt level: O1

void NFastOps::LogAvx<true,false>(double *from,size_t size,double *to)

{
  undefined8 uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [32];
  bool bVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar24;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  double dVar23;
  double dVar25;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar10 [16];
  undefined1 auVar22 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double dVar47;
  double dVar48;
  double dVar49;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  double dVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  double dVar88;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  double dVar87;
  double dVar89;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  double dVar106;
  double dVar108;
  double dVar109;
  double dVar110;
  undefined1 auVar107 [32];
  
  uVar3 = size * 8 & 0xffffffffffffffc0;
  if (uVar3 != 0) {
    uVar4 = 0;
    auVar31._8_8_ = 0x3ff0000000000000;
    auVar31._0_8_ = 0x3ff0000000000000;
    auVar31._16_8_ = 0x3ff0000000000000;
    auVar31._24_8_ = 0x3ff0000000000000;
    auVar10._8_8_ = 0x4337fffffffffc01;
    auVar10._0_8_ = 0x4337fffffffffc01;
    do {
      auVar17 = *(undefined1 (*) [32])((long)from + uVar4);
      auVar34 = vpsrlq_avx(auVar17._0_16_,0x34);
      auVar90 = *(undefined1 (*) [16])((long)from + uVar4 + 0x10);
      auVar9 = vpsrlq_avx(auVar90,0x34);
      auVar45._0_8_ = -(ulong)(auVar34._0_8_ == 0);
      auVar45._8_8_ = -(ulong)(auVar34._8_8_ == 0);
      auVar30._0_8_ = -(ulong)(auVar9._0_8_ == 0);
      uVar2 = (ulong)(auVar9._8_8_ == 0);
      auVar30._8_8_ = -uVar2;
      auVar45._16_16_ = auVar30;
      auVar72 = ZEXT832(0) << 0x40;
      if ((((auVar45 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           SUB321(auVar45 >> 0x7f,0) == '\0') && SUB161(auVar30 >> 0x3f,0) == '\0') && uVar2 == 0) {
        auVar34 = vpaddq_avx(auVar10,auVar34);
        auVar9 = vpaddq_avx(auVar10,auVar9);
        dVar33 = auVar34._0_8_ + -6755399441055744.0;
        dVar47 = auVar34._8_8_ + -6755399441055744.0;
        dVar48 = auVar9._0_8_ + -6755399441055744.0;
        dVar49 = auVar9._8_8_ + -6755399441055744.0;
        auVar15 = auVar17;
      }
      else {
        auVar14._8_8_ = 0x4330000000000000;
        auVar14._0_8_ = 0x4330000000000000;
        auVar14._16_8_ = 0x4330000000000000;
        auVar14._24_8_ = 0x4330000000000000;
        auVar14 = vblendvpd_avx(auVar31,auVar14,auVar45);
        auVar9._0_8_ = auVar17._0_8_ * auVar14._0_8_;
        auVar9._8_8_ = auVar17._8_8_ * auVar14._8_8_;
        auVar15._16_8_ = auVar17._16_8_ * auVar14._16_8_;
        auVar15._0_16_ = auVar9;
        auVar15._24_8_ = auVar17._24_8_ * auVar14._24_8_;
        auVar39._8_8_ = 0xc04a000000000000;
        auVar39._0_8_ = 0xc04a000000000000;
        auVar39._16_8_ = 0xc04a000000000000;
        auVar39._24_8_ = 0xc04a000000000000;
        auVar45 = vblendvpd_avx(auVar72,auVar39,auVar45);
        auVar9 = vpsrlq_avx(auVar9,0x34);
        auVar34 = vpsrlq_avx(auVar15._16_16_,0x34);
        auVar9 = vpaddq_avx(auVar10,auVar9);
        auVar34 = vpaddq_avx(auVar34,auVar10);
        dVar33 = auVar45._0_8_ + auVar9._0_8_ + -6755399441055744.0;
        dVar47 = auVar45._8_8_ + auVar9._8_8_ + -6755399441055744.0;
        dVar48 = auVar45._16_8_ + auVar34._0_8_ + -6755399441055744.0;
        dVar49 = auVar45._24_8_ + auVar34._8_8_ + -6755399441055744.0;
      }
      auVar78._8_8_ = 0xfffffffffffff;
      auVar78._0_8_ = 0xfffffffffffff;
      auVar78._16_8_ = 0xfffffffffffff;
      auVar78._24_8_ = 0xfffffffffffff;
      auVar45 = vandpd_avx(auVar15,auVar78);
      auVar79._8_8_ = 0x3fe0000000000000;
      auVar79._0_8_ = 0x3fe0000000000000;
      auVar79._16_8_ = 0x3fe0000000000000;
      auVar79._24_8_ = 0x3fe0000000000000;
      auVar15 = vorpd_avx(auVar45,auVar79);
      auVar80._8_8_ = 0x3fe6a09e667f3bcd;
      auVar80._0_8_ = 0x3fe6a09e667f3bcd;
      auVar80._16_8_ = 0x3fe6a09e667f3bcd;
      auVar80._24_8_ = 0x3fe6a09e667f3bcd;
      auVar14 = vcmppd_avx(auVar80,auVar15,1);
      auVar45 = vandnpd_avx(auVar14,auVar15);
      dVar8 = auVar45._0_8_ + auVar15._0_8_;
      dVar23 = auVar45._8_8_ + auVar15._8_8_;
      dVar24 = auVar45._16_8_ + auVar15._16_8_;
      dVar25 = auVar45._24_8_ + auVar15._24_8_;
      auVar45 = vandpd_avx(auVar14,auVar31);
      dVar75 = dVar8 + -1.0;
      dVar87 = dVar23 + -1.0;
      dVar88 = dVar24 + -1.0;
      dVar89 = dVar25 + -1.0;
      dVar106 = dVar75 * dVar75;
      dVar108 = dVar87 * dVar87;
      dVar109 = dVar88 * dVar88;
      dVar110 = dVar89 * dVar89;
      auVar16._0_8_ =
           (dVar33 + auVar45._0_8_) * 0.6931471805599453 +
           dVar75 * ((dVar106 + dVar8 * -0.12132034355964258) *
                     (dVar75 * -0.24604261088172152 + 0.3274040414833277 +
                      dVar106 * (dVar75 * -0.16440826988949675 + 0.19717056511718561) +
                     dVar106 * dVar106 *
                     (dVar106 * (dVar75 * -0.0766482905246683 + 0.12052759639123857) +
                     dVar75 * -0.12732281415503188 + 0.14089176364079287)) +
                     dVar75 * -0.4901290717342736 + 1.0397207708399179);
      auVar16._8_8_ =
           (dVar47 + auVar45._8_8_) * 0.6931471805599453 +
           dVar87 * ((dVar108 + dVar23 * -0.12132034355964258) *
                     (dVar87 * -0.24604261088172152 + 0.3274040414833277 +
                      dVar108 * (dVar87 * -0.16440826988949675 + 0.19717056511718561) +
                     dVar108 * dVar108 *
                     (dVar108 * (dVar87 * -0.0766482905246683 + 0.12052759639123857) +
                     dVar87 * -0.12732281415503188 + 0.14089176364079287)) +
                     dVar87 * -0.4901290717342736 + 1.0397207708399179);
      auVar16._16_8_ =
           (dVar48 + auVar45._16_8_) * 0.6931471805599453 +
           dVar88 * ((dVar109 + dVar24 * -0.12132034355964258) *
                     (dVar88 * -0.24604261088172152 + 0.3274040414833277 +
                      dVar109 * (dVar88 * -0.16440826988949675 + 0.19717056511718561) +
                     dVar109 * dVar109 *
                     (dVar109 * (dVar88 * -0.0766482905246683 + 0.12052759639123857) +
                     dVar88 * -0.12732281415503188 + 0.14089176364079287)) +
                     dVar88 * -0.4901290717342736 + 1.0397207708399179);
      auVar16._24_8_ =
           (dVar49 + auVar45._24_8_) * 0.6931471805599453 +
           dVar89 * ((dVar110 + dVar25 * -0.12132034355964258) *
                     (dVar89 * -0.24604261088172152 + 0.3274040414833277 +
                      dVar110 * (dVar89 * -0.16440826988949675 + 0.19717056511718561) +
                     dVar110 * dVar110 *
                     (dVar110 * (dVar89 * -0.0766482905246683 + 0.12052759639123857) +
                     dVar89 * -0.12732281415503188 + 0.14089176364079287)) +
                     dVar89 * -0.4901290717342736 + 1.0397207708399179);
      auVar40._0_8_ = -(ulong)(auVar17._0_8_ == INFINITY);
      auVar40._8_8_ = -(ulong)(auVar17._8_8_ == INFINITY);
      auVar40._24_8_ = -(ulong)(auVar90._8_8_ == 0x7ff0000000000000);
      auVar40._16_8_ = -(ulong)(auVar90._0_8_ == 0x7ff0000000000000);
      auVar45 = vcmppd_avx(auVar72,auVar17,1);
      auVar45 = vandnpd_avx(auVar40,auVar45);
      auVar15 = ZEXT832(0) << 0x40;
      auVar14 = vcmpps_avx(auVar15,auVar15,0xf);
      auVar45 = auVar14 & ~auVar45;
      if ((((auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           SUB321(auVar45 >> 0x7f,0) != '\0') || SUB321(auVar45 >> 0xbf,0) != '\0') ||
          auVar45[0x1f] < '\0') {
        auVar45 = vcmppd_avx(auVar17,auVar15,0);
        auVar39 = vorpd_avx(auVar45,auVar40);
        auVar97._8_8_ = 0xfff0000000000000;
        auVar97._0_8_ = 0xfff0000000000000;
        auVar97._16_8_ = 0xfff0000000000000;
        auVar97._24_8_ = 0xfff0000000000000;
        auVar102._8_8_ = 0x7ff0000000000000;
        auVar102._0_8_ = 0x7ff0000000000000;
        auVar102._16_8_ = 0x7ff0000000000000;
        auVar102._24_8_ = 0x7ff0000000000000;
        auVar45 = vblendvpd_avx(auVar102,auVar97,auVar45);
        auVar45 = vblendvpd_avx(auVar17,auVar45,auVar39);
        auVar15 = vcmppd_avx(auVar17,auVar15,3);
        auVar15 = vorpd_avx(auVar15,auVar39);
        auVar98._8_8_ = 0x8000000000000000;
        auVar98._0_8_ = 0x8000000000000000;
        auVar98._16_8_ = 0x8000000000000000;
        auVar98._24_8_ = 0x8000000000000000;
        auVar17 = vandpd_avx(auVar17,auVar98);
        auVar9 = vpsrad_avx(auVar17._0_16_,0xc);
        auVar90 = vpsrad_avx(auVar17._16_16_,0xc);
        auVar17._0_8_ = auVar16._0_8_ + auVar9._0_8_;
        auVar17._8_8_ = auVar16._8_8_ + auVar9._8_8_;
        auVar17._16_8_ = auVar16._16_8_ + auVar90._0_8_;
        auVar17._24_8_ = auVar16._24_8_ + auVar90._8_8_;
        auVar16 = vblendvpd_avx(auVar17,auVar45,auVar15);
      }
      *(undefined1 (*) [32])((long)to + uVar4) = auVar16;
      auVar17 = *(undefined1 (*) [32])((long)from + uVar4 + 0x20);
      auVar34 = vpsrlq_avx(auVar17._0_16_,0x34);
      auVar90 = *(undefined1 (*) [16])((long)from + uVar4 + 0x30);
      auVar9 = vpsrlq_avx(auVar90,0x34);
      auVar81._0_8_ = -(ulong)(auVar34._0_8_ == 0);
      auVar81._8_8_ = -(ulong)(auVar34._8_8_ == 0);
      auVar91._0_8_ = -(ulong)(auVar9._0_8_ == 0);
      uVar2 = (ulong)(auVar9._8_8_ == 0);
      auVar91._8_8_ = -uVar2;
      auVar81._16_16_ = auVar91;
      if ((((auVar81 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           SUB321(auVar81 >> 0x7f,0) == '\0') && SUB161(auVar91 >> 0x3f,0) == '\0') && uVar2 == 0) {
        auVar34 = vpaddq_avx(auVar10,auVar34);
        auVar9 = vpaddq_avx(auVar10,auVar9);
        dVar33 = auVar34._0_8_ + -6755399441055744.0;
        dVar47 = auVar34._8_8_ + -6755399441055744.0;
        dVar48 = auVar9._0_8_ + -6755399441055744.0;
        dVar49 = auVar9._8_8_ + -6755399441055744.0;
        auVar19 = auVar17;
      }
      else {
        auVar18._8_8_ = 0x4330000000000000;
        auVar18._0_8_ = 0x4330000000000000;
        auVar18._16_8_ = 0x4330000000000000;
        auVar18._24_8_ = 0x4330000000000000;
        auVar45 = vblendvpd_avx(auVar31,auVar18,auVar81);
        auVar34._0_8_ = auVar17._0_8_ * auVar45._0_8_;
        auVar34._8_8_ = auVar17._8_8_ * auVar45._8_8_;
        auVar19._16_8_ = auVar17._16_8_ * auVar45._16_8_;
        auVar19._0_16_ = auVar34;
        auVar19._24_8_ = auVar17._24_8_ * auVar45._24_8_;
        auVar41._8_8_ = 0xc04a000000000000;
        auVar41._0_8_ = 0xc04a000000000000;
        auVar41._16_8_ = 0xc04a000000000000;
        auVar41._24_8_ = 0xc04a000000000000;
        auVar45 = vblendvpd_avx(auVar72,auVar41,auVar81);
        auVar9 = vpsrlq_avx(auVar34,0x34);
        auVar34 = vpsrlq_avx(auVar19._16_16_,0x34);
        auVar9 = vpaddq_avx(auVar10,auVar9);
        auVar34 = vpaddq_avx(auVar10,auVar34);
        dVar33 = auVar45._0_8_ + auVar9._0_8_ + -6755399441055744.0;
        dVar47 = auVar45._8_8_ + auVar9._8_8_ + -6755399441055744.0;
        dVar48 = auVar45._16_8_ + auVar34._0_8_ + -6755399441055744.0;
        dVar49 = auVar45._24_8_ + auVar34._8_8_ + -6755399441055744.0;
      }
      auVar82._8_8_ = 0xfffffffffffff;
      auVar82._0_8_ = 0xfffffffffffff;
      auVar82._16_8_ = 0xfffffffffffff;
      auVar82._24_8_ = 0xfffffffffffff;
      auVar45 = vandpd_avx(auVar19,auVar82);
      auVar83._8_8_ = 0x3fe0000000000000;
      auVar83._0_8_ = 0x3fe0000000000000;
      auVar83._16_8_ = 0x3fe0000000000000;
      auVar83._24_8_ = 0x3fe0000000000000;
      auVar39 = vorpd_avx(auVar45,auVar83);
      auVar84._8_8_ = 0x3fe6a09e667f3bcd;
      auVar84._0_8_ = 0x3fe6a09e667f3bcd;
      auVar84._16_8_ = 0x3fe6a09e667f3bcd;
      auVar84._24_8_ = 0x3fe6a09e667f3bcd;
      auVar15 = vcmppd_avx(auVar84,auVar39,1);
      auVar45 = vandnpd_avx(auVar15,auVar39);
      dVar8 = auVar45._0_8_ + auVar39._0_8_;
      dVar23 = auVar45._8_8_ + auVar39._8_8_;
      dVar24 = auVar45._16_8_ + auVar39._16_8_;
      dVar25 = auVar45._24_8_ + auVar39._24_8_;
      auVar45 = vandpd_avx(auVar15,auVar31);
      dVar106 = dVar8 + -1.0;
      dVar108 = dVar23 + -1.0;
      dVar109 = dVar24 + -1.0;
      dVar110 = dVar25 + -1.0;
      dVar75 = dVar106 * dVar106;
      dVar87 = dVar108 * dVar108;
      dVar88 = dVar109 * dVar109;
      dVar89 = dVar110 * dVar110;
      auVar107._8_8_ = -(ulong)(auVar17._8_8_ == INFINITY);
      auVar107._0_8_ = -(ulong)(auVar17._0_8_ == INFINITY);
      auVar107._24_8_ = -(ulong)(auVar90._8_8_ == 0x7ff0000000000000);
      auVar107._16_8_ = -(ulong)(auVar90._0_8_ == 0x7ff0000000000000);
      auVar15 = vcmppd_avx(auVar72,auVar17,1);
      auVar15 = vandnpd_avx(auVar107,auVar15);
      auVar14 = auVar14 & ~auVar15;
      auVar20._0_8_ =
           (dVar33 + auVar45._0_8_) * 0.6931471805599453 +
           dVar106 * ((dVar75 + dVar8 * -0.12132034355964258) *
                      (dVar106 * -0.24604261088172152 + 0.3274040414833277 +
                       dVar75 * (dVar106 * -0.16440826988949675 + 0.19717056511718561) +
                      dVar75 * dVar75 *
                      (dVar106 * -0.12732281415503188 + 0.14089176364079287 +
                      dVar75 * (dVar106 * -0.0766482905246683 + 0.12052759639123857))) +
                      dVar106 * -0.4901290717342736 + 1.0397207708399179);
      auVar20._8_8_ =
           (dVar47 + auVar45._8_8_) * 0.6931471805599453 +
           dVar108 * ((dVar87 + dVar23 * -0.12132034355964258) *
                      (dVar108 * -0.24604261088172152 + 0.3274040414833277 +
                       dVar87 * (dVar108 * -0.16440826988949675 + 0.19717056511718561) +
                      dVar87 * dVar87 *
                      (dVar108 * -0.12732281415503188 + 0.14089176364079287 +
                      dVar87 * (dVar108 * -0.0766482905246683 + 0.12052759639123857))) +
                      dVar108 * -0.4901290717342736 + 1.0397207708399179);
      auVar20._16_8_ =
           (dVar48 + auVar45._16_8_) * 0.6931471805599453 +
           dVar109 * ((dVar88 + dVar24 * -0.12132034355964258) *
                      (dVar109 * -0.24604261088172152 + 0.3274040414833277 +
                       dVar88 * (dVar109 * -0.16440826988949675 + 0.19717056511718561) +
                      dVar88 * dVar88 *
                      (dVar109 * -0.12732281415503188 + 0.14089176364079287 +
                      dVar88 * (dVar109 * -0.0766482905246683 + 0.12052759639123857))) +
                      dVar109 * -0.4901290717342736 + 1.0397207708399179);
      auVar20._24_8_ =
           (dVar49 + auVar45._24_8_) * 0.6931471805599453 +
           dVar110 * ((dVar89 + dVar25 * -0.12132034355964258) *
                      (dVar110 * -0.24604261088172152 + 0.3274040414833277 +
                       dVar89 * (dVar110 * -0.16440826988949675 + 0.19717056511718561) +
                      dVar89 * dVar89 *
                      (dVar110 * -0.12732281415503188 + 0.14089176364079287 +
                      dVar89 * (dVar110 * -0.0766482905246683 + 0.12052759639123857))) +
                      dVar110 * -0.4901290717342736 + 1.0397207708399179);
      if ((((auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           SUB321(auVar14 >> 0x7f,0) != '\0') || SUB321(auVar14 >> 0xbf,0) != '\0') ||
          auVar14[0x1f] < '\0') {
        auVar45 = vcmppd_avx(auVar17,auVar72,0);
        auVar14 = vorpd_avx(auVar107,auVar45);
        auVar99._8_8_ = 0xfff0000000000000;
        auVar99._0_8_ = 0xfff0000000000000;
        auVar99._16_8_ = 0xfff0000000000000;
        auVar99._24_8_ = 0xfff0000000000000;
        auVar103._8_8_ = 0x7ff0000000000000;
        auVar103._0_8_ = 0x7ff0000000000000;
        auVar103._16_8_ = 0x7ff0000000000000;
        auVar103._24_8_ = 0x7ff0000000000000;
        auVar45 = vblendvpd_avx(auVar103,auVar99,auVar45);
        auVar45 = vblendvpd_avx(auVar17,auVar45,auVar14);
        auVar72 = vcmppd_avx(auVar17,auVar72,3);
        auVar72 = vorpd_avx(auVar72,auVar14);
        auVar100._8_8_ = 0x8000000000000000;
        auVar100._0_8_ = 0x8000000000000000;
        auVar100._16_8_ = 0x8000000000000000;
        auVar100._24_8_ = 0x8000000000000000;
        auVar17 = vandpd_avx(auVar17,auVar100);
        auVar9 = vpsrad_avx(auVar17._0_16_,0xc);
        auVar90 = vpsrad_avx(auVar17._16_16_,0xc);
        auVar21._0_8_ = auVar20._0_8_ + auVar9._0_8_;
        auVar21._8_8_ = auVar20._8_8_ + auVar9._8_8_;
        auVar21._16_8_ = auVar20._16_8_ + auVar90._0_8_;
        auVar21._24_8_ = auVar20._24_8_ + auVar90._8_8_;
        auVar20 = vblendvpd_avx(auVar21,auVar45,auVar72);
      }
      *(undefined1 (*) [32])((long)to + uVar4 + 0x20) = auVar20;
      uVar4 = uVar4 + 0x40;
    } while (uVar4 < uVar3);
  }
  pauVar6 = (undefined1 (*) [32])((long)from + uVar3);
  pauVar5 = (undefined1 (*) [32])((long)to + uVar3);
  if ((size & 4) != 0) {
    auVar31 = *pauVar6;
    auVar9 = vpsrlq_avx(auVar31._0_16_,0x34);
    auVar10 = *(undefined1 (*) [16])(*pauVar6 + 0x10);
    auVar90 = vpsrlq_avx(auVar10,0x34);
    auVar72._8_8_ = -(ulong)(auVar9._8_8_ == 0);
    auVar72._0_8_ = -(ulong)(auVar9._0_8_ == 0);
    auVar64._0_8_ = -(ulong)(auVar90._0_8_ == 0);
    uVar3 = (ulong)(auVar90._8_8_ == 0);
    auVar64._8_8_ = -uVar3;
    auVar72._16_16_ = auVar64;
    if ((((auVar72 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
         SUB321(auVar72 >> 0x7f,0) == '\0') && SUB161(auVar64 >> 0x3f,0) == '\0') && uVar3 == 0) {
      auVar65._8_8_ = 0x4337fffffffffc01;
      auVar65._0_8_ = 0x4337fffffffffc01;
      auVar9 = vpaddq_avx(auVar9,auVar65);
      auVar90 = vpaddq_avx(auVar90,auVar65);
      dVar33 = auVar9._0_8_ + -6755399441055744.0;
      dVar47 = auVar9._8_8_ + -6755399441055744.0;
      dVar48 = auVar90._0_8_ + -6755399441055744.0;
      dVar49 = auVar90._8_8_ + -6755399441055744.0;
      auVar43 = auVar31;
    }
    else {
      auVar42._8_8_ = 0x4330000000000000;
      auVar42._0_8_ = 0x4330000000000000;
      auVar42._16_8_ = 0x4330000000000000;
      auVar42._24_8_ = 0x4330000000000000;
      auVar61._8_8_ = 0x3ff0000000000000;
      auVar61._0_8_ = 0x3ff0000000000000;
      auVar61._16_8_ = 0x3ff0000000000000;
      auVar61._24_8_ = 0x3ff0000000000000;
      auVar17 = vblendvpd_avx(auVar61,auVar42,auVar72);
      auVar62._8_8_ = 0xc04a000000000000;
      auVar62._0_8_ = 0xc04a000000000000;
      auVar62._16_8_ = 0xc04a000000000000;
      auVar62._24_8_ = 0xc04a000000000000;
      auVar72 = vblendvpd_avx(ZEXT1632((undefined1  [16])0x0),auVar62,auVar72);
      auVar90._0_8_ = auVar31._0_8_ * auVar17._0_8_;
      auVar90._8_8_ = auVar31._8_8_ * auVar17._8_8_;
      auVar43._16_8_ = auVar31._16_8_ * auVar17._16_8_;
      auVar43._0_16_ = auVar90;
      auVar43._24_8_ = auVar31._24_8_ * auVar17._24_8_;
      auVar90 = vpsrlq_avx(auVar90,0x34);
      auVar9 = vpsrlq_avx(auVar43._16_16_,0x34);
      auVar92._8_8_ = 0x4337fffffffffc01;
      auVar92._0_8_ = 0x4337fffffffffc01;
      auVar90 = vpaddq_avx(auVar90,auVar92);
      auVar9 = vpaddq_avx(auVar9,auVar92);
      dVar33 = auVar72._0_8_ + auVar90._0_8_ + -6755399441055744.0;
      dVar47 = auVar72._8_8_ + auVar90._8_8_ + -6755399441055744.0;
      dVar48 = auVar72._16_8_ + auVar9._0_8_ + -6755399441055744.0;
      dVar49 = auVar72._24_8_ + auVar9._8_8_ + -6755399441055744.0;
    }
    auVar73._8_8_ = 0xfffffffffffff;
    auVar73._0_8_ = 0xfffffffffffff;
    auVar73._16_8_ = 0xfffffffffffff;
    auVar73._24_8_ = 0xfffffffffffff;
    auVar85._8_8_ = 0x3fe0000000000000;
    auVar85._0_8_ = 0x3fe0000000000000;
    auVar85._16_8_ = 0x3fe0000000000000;
    auVar85._24_8_ = 0x3fe0000000000000;
    auVar17 = vandpd_avx(auVar43,auVar73);
    auVar45 = vorpd_avx(auVar17,auVar85);
    auVar44._8_8_ = 0x3fe6a09e667f3bcd;
    auVar44._0_8_ = 0x3fe6a09e667f3bcd;
    auVar44._16_8_ = 0x3fe6a09e667f3bcd;
    auVar44._24_8_ = 0x3fe6a09e667f3bcd;
    auVar72 = vcmppd_avx(auVar44,auVar45,1);
    auVar17 = vandnpd_avx(auVar72,auVar45);
    dVar75 = auVar17._0_8_ + auVar45._0_8_;
    dVar87 = auVar17._8_8_ + auVar45._8_8_;
    dVar88 = auVar17._16_8_ + auVar45._16_8_;
    dVar89 = auVar17._24_8_ + auVar45._24_8_;
    auVar74._8_8_ = 0x3ff0000000000000;
    auVar74._0_8_ = 0x3ff0000000000000;
    auVar74._16_8_ = 0x3ff0000000000000;
    auVar74._24_8_ = 0x3ff0000000000000;
    auVar17 = vandpd_avx(auVar72,auVar74);
    dVar8 = dVar75 + -1.0;
    dVar23 = dVar87 + -1.0;
    dVar24 = dVar88 + -1.0;
    dVar25 = dVar89 + -1.0;
    dVar106 = dVar8 * dVar8;
    dVar108 = dVar23 * dVar23;
    dVar109 = dVar24 * dVar24;
    dVar110 = dVar25 * dVar25;
    auVar63._0_8_ =
         (dVar33 + auVar17._0_8_) * 0.6931471805599453 +
         dVar8 * ((dVar106 + dVar75 * -0.12132034355964258) *
                  (dVar106 * dVar106 *
                   (dVar8 * -0.12732281415503188 + 0.14089176364079287 +
                   (dVar8 * -0.0766482905246683 + 0.12052759639123857) * dVar106) +
                  (dVar8 * -0.16440826988949675 + 0.19717056511718561) * dVar106 +
                  dVar8 * -0.24604261088172152 + 0.3274040414833277) + dVar8 * -0.4901290717342736 +
                 1.0397207708399179);
    auVar63._8_8_ =
         (dVar47 + auVar17._8_8_) * 0.6931471805599453 +
         dVar23 * ((dVar108 + dVar87 * -0.12132034355964258) *
                   (dVar108 * dVar108 *
                    (dVar23 * -0.12732281415503188 + 0.14089176364079287 +
                    (dVar23 * -0.0766482905246683 + 0.12052759639123857) * dVar108) +
                   (dVar23 * -0.16440826988949675 + 0.19717056511718561) * dVar108 +
                   dVar23 * -0.24604261088172152 + 0.3274040414833277) +
                   dVar23 * -0.4901290717342736 + 1.0397207708399179);
    auVar63._16_8_ =
         (dVar48 + auVar17._16_8_) * 0.6931471805599453 +
         dVar24 * ((dVar109 + dVar88 * -0.12132034355964258) *
                   (dVar109 * dVar109 *
                    (dVar24 * -0.12732281415503188 + 0.14089176364079287 +
                    (dVar24 * -0.0766482905246683 + 0.12052759639123857) * dVar109) +
                   (dVar24 * -0.16440826988949675 + 0.19717056511718561) * dVar109 +
                   dVar24 * -0.24604261088172152 + 0.3274040414833277) +
                   dVar24 * -0.4901290717342736 + 1.0397207708399179);
    auVar63._24_8_ =
         (dVar49 + auVar17._24_8_) * 0.6931471805599453 +
         dVar25 * ((dVar110 + dVar89 * -0.12132034355964258) *
                   (dVar110 * dVar110 *
                    (dVar25 * -0.12732281415503188 + 0.14089176364079287 +
                    (dVar25 * -0.0766482905246683 + 0.12052759639123857) * dVar110) +
                   (dVar25 * -0.16440826988949675 + 0.19717056511718561) * dVar110 +
                   dVar25 * -0.24604261088172152 + 0.3274040414833277) +
                   dVar25 * -0.4901290717342736 + 1.0397207708399179);
    auVar32._8_8_ = -(ulong)(auVar31._8_8_ == INFINITY);
    auVar32._0_8_ = -(ulong)(auVar31._0_8_ == INFINITY);
    auVar32._24_8_ = -(ulong)(auVar10._8_8_ == 0x7ff0000000000000);
    auVar32._16_8_ = -(ulong)(auVar10._0_8_ == 0x7ff0000000000000);
    auVar17 = vcmppd_avx(ZEXT832(0) << 0x40,auVar31,1);
    auVar17 = vandnpd_avx(auVar32,auVar17);
    auVar45 = ZEXT832(0) << 0x40;
    auVar72 = vcmpps_avx(ZEXT832(0) << 0x40,auVar45,0xf);
    auVar72 = auVar72 & ~auVar17;
    if ((((auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
         SUB321(auVar72 >> 0x7f,0) != '\0') || SUB321(auVar72 >> 0xbf,0) != '\0') ||
        auVar72[0x1f] < '\0') {
      auVar17 = vcmppd_avx(auVar31,auVar45,0);
      auVar14 = vorpd_avx(auVar17,auVar32);
      auVar86._8_8_ = 0xfff0000000000000;
      auVar86._0_8_ = 0xfff0000000000000;
      auVar86._16_8_ = 0xfff0000000000000;
      auVar86._24_8_ = 0xfff0000000000000;
      auVar101._8_8_ = 0x7ff0000000000000;
      auVar101._0_8_ = 0x7ff0000000000000;
      auVar101._16_8_ = 0x7ff0000000000000;
      auVar101._24_8_ = 0x7ff0000000000000;
      auVar17 = vblendvpd_avx(auVar101,auVar86,auVar17);
      auVar17 = vblendvpd_avx(auVar31,auVar17,auVar14);
      auVar72 = vcmppd_avx(auVar31,auVar45,3);
      auVar72 = vorpd_avx(auVar72,auVar14);
      auVar46._8_8_ = 0x8000000000000000;
      auVar46._0_8_ = 0x8000000000000000;
      auVar46._16_8_ = 0x8000000000000000;
      auVar46._24_8_ = 0x8000000000000000;
      auVar31 = vandpd_avx(auVar31,auVar46);
      auVar90 = vpsrad_avx(auVar31._0_16_,0xc);
      auVar10 = vpsrad_avx(auVar31._16_16_,0xc);
      auVar22._0_8_ = auVar63._0_8_ + auVar90._0_8_;
      auVar22._8_8_ = auVar63._8_8_ + auVar90._8_8_;
      auVar22._16_8_ = auVar63._16_8_ + auVar10._0_8_;
      auVar22._24_8_ = auVar63._24_8_ + auVar10._8_8_;
      auVar63 = vblendvpd_avx(auVar22,auVar17,auVar72);
    }
    *pauVar5 = auVar63;
    pauVar5 = pauVar5 + 1;
    pauVar6 = pauVar6 + 1;
  }
  if ((size & 2) != 0) {
    auVar10 = *(undefined1 (*) [16])*pauVar6;
    dVar33 = auVar10._0_8_;
    auVar26._0_8_ = -dVar33;
    auVar26._8_4_ = auVar10._8_4_;
    auVar26._12_4_ = auVar10._12_4_ ^ 0x80000000;
    auVar35._8_8_ = 0x800fffffffffffff;
    auVar35._0_8_ = 0x800fffffffffffff;
    auVar9 = vpcmpgtq_avx(auVar26,auVar35);
    auVar90 = vpcmpeqd_avx(auVar26,auVar26);
    if (((auVar90 & ~auVar9) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar90 & ~auVar9,0xf)) {
      auVar90 = vpsrlq_avx(auVar10,0x34);
      auVar36._8_8_ = 0x4337fffffffffc01;
      auVar36._0_8_ = 0x4337fffffffffc01;
      auVar90 = vpaddq_avx(auVar90,auVar36);
      dVar47 = auVar90._0_8_ + -6755399441055744.0;
      dVar48 = auVar90._8_8_ + -6755399441055744.0;
      auVar28 = auVar10;
    }
    else {
      auVar27._8_8_ = 0x3ff0000000000000;
      auVar27._0_8_ = 0x3ff0000000000000;
      auVar50._8_8_ = 0x4330000000000000;
      auVar50._0_8_ = 0x4330000000000000;
      auVar90 = vblendvpd_avx(auVar50,auVar27,auVar9);
      auVar28._0_8_ = dVar33 * auVar90._0_8_;
      auVar28._8_8_ = auVar10._8_8_ * auVar90._8_8_;
      auVar51._8_8_ = 0xc04a000000000000;
      auVar51._0_8_ = 0xc04a000000000000;
      auVar90 = vandnpd_avx(auVar9,auVar51);
      auVar9 = vpsrlq_avx(auVar28,0x34);
      auVar66._8_8_ = 0x4337fffffffffc01;
      auVar66._0_8_ = 0x4337fffffffffc01;
      auVar9 = vpaddq_avx(auVar9,auVar66);
      dVar47 = auVar90._0_8_ + auVar9._0_8_ + -6755399441055744.0;
      dVar48 = auVar90._8_8_ + auVar9._8_8_ + -6755399441055744.0;
    }
    auVar52._8_8_ = 0xfffffffffffff;
    auVar52._0_8_ = 0xfffffffffffff;
    auVar90 = vandpd_avx(auVar28,auVar52);
    auVar53._8_8_ = 0x3fe0000000000000;
    auVar53._0_8_ = 0x3fe0000000000000;
    auVar34 = vorpd_avx(auVar90,auVar53);
    auVar29._8_8_ = 0x3fe6a09e667f3bcd;
    auVar29._0_8_ = 0x3fe6a09e667f3bcd;
    auVar9 = vcmppd_avx(auVar29,auVar34,1);
    auVar90 = vandnpd_avx(auVar9,auVar34);
    auVar30 = ZEXT816(0);
    dVar25 = auVar90._0_8_ + auVar34._0_8_;
    dVar75 = auVar90._8_8_ + auVar34._8_8_;
    auVar54._8_8_ = 0x3ff0000000000000;
    auVar54._0_8_ = 0x3ff0000000000000;
    auVar90 = vandpd_avx(auVar9,auVar54);
    dVar49 = dVar25 + -1.0;
    dVar8 = dVar75 + -1.0;
    dVar23 = dVar49 * dVar49;
    dVar24 = dVar8 * dVar8;
    auVar93._0_8_ =
         dVar49 * -0.24604261088172152 + 0.3274040414833277 +
         dVar23 * (dVar49 * -0.16440826988949675 + 0.19717056511718561) +
         dVar23 * dVar23 *
         (dVar49 * -0.12732281415503188 + 0.14089176364079287 +
         (dVar49 * -0.0766482905246683 + 0.12052759639123857) * dVar23);
    auVar93._8_8_ =
         dVar8 * -0.24604261088172152 + 0.3274040414833277 +
         dVar24 * (dVar8 * -0.16440826988949675 + 0.19717056511718561) +
         dVar24 * dVar24 *
         (dVar8 * -0.12732281415503188 + 0.14089176364079287 +
         (dVar8 * -0.0766482905246683 + 0.12052759639123857) * dVar24);
    auVar37._0_8_ =
         (dVar47 + auVar90._0_8_) * 0.6931471805599453 +
         dVar49 * ((dVar23 + dVar25 * -0.12132034355964258) * auVar93._0_8_ +
                   dVar49 * -0.4901290717342736 + 1.0397207708399179);
    auVar37._8_8_ =
         (dVar48 + auVar90._8_8_) * 0.6931471805599453 +
         dVar8 * ((dVar24 + dVar75 * -0.12132034355964258) * auVar93._8_8_ +
                  dVar8 * -0.4901290717342736 + 1.0397207708399179);
    auVar67._8_8_ = 0x7ff0000000000000;
    auVar67._0_8_ = 0x7ff0000000000000;
    auVar90 = vcmppd_avx(auVar30,auVar10,1);
    auVar55._0_8_ = -(ulong)(dVar33 == INFINITY);
    auVar55._8_8_ = -(ulong)(auVar10._8_8_ == INFINITY);
    auVar90 = vpandn_avx(auVar55,auVar90);
    auVar9 = vpcmpeqd_avx(auVar93,auVar93);
    if (((auVar9 & ~auVar90) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
        SUB161(auVar9 & ~auVar90,0xf) < '\0') {
      auVar90 = vblendvpd_avx(auVar10,auVar67,auVar55);
      auVar9 = vcmppd_avx(auVar10,auVar30,0);
      auVar94._8_8_ = 0xfff0000000000000;
      auVar94._0_8_ = 0xfff0000000000000;
      auVar90 = vblendvpd_avx(auVar90,auVar94,auVar9);
      auVar9 = vcmppd_avx(auVar10,auVar30,8);
      auVar10 = vpsrad_avx(auVar10,0xc);
      auVar34 = vpand_avx(auVar10,_DAT_00191da0);
      auVar10 = vorpd_avx(auVar55,auVar9);
      auVar11._0_8_ = auVar37._0_8_ + auVar34._0_8_;
      auVar11._8_8_ = auVar37._8_8_ + auVar34._8_8_;
      auVar37 = vblendvpd_avx(auVar11,auVar90,auVar10);
    }
    *(undefined1 (*) [16])*pauVar5 = auVar37;
    pauVar5 = (undefined1 (*) [32])(*pauVar5 + 0x10);
    pauVar6 = (undefined1 (*) [32])(*pauVar6 + 0x10);
  }
  if ((size & 1) != 0) {
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(ulong *)*pauVar6;
    auVar10 = vorps_avx(auVar12,_DAT_00191db0);
    dVar33 = auVar10._0_8_;
    auVar38._0_8_ = -dVar33;
    auVar38._8_4_ = auVar10._8_4_;
    auVar38._12_4_ = auVar10._12_4_ ^ 0x80000000;
    auVar56._8_8_ = 0x800fffffffffffff;
    auVar56._0_8_ = 0x800fffffffffffff;
    auVar9 = vpcmpgtq_avx(auVar38,auVar56);
    auVar90 = vpcmpeqd_avx(auVar56,auVar56);
    dVar47 = auVar10._8_8_;
    if (((auVar90 & ~auVar9) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
        -1 < SUB161(auVar90 & ~auVar9,0xf)) {
      auVar90 = vpsrlq_avx(auVar10,0x34);
      auVar57._8_8_ = 0x4337fffffffffc01;
      auVar57._0_8_ = 0x4337fffffffffc01;
      auVar90 = vpaddq_avx(auVar90,auVar57);
      dVar48 = auVar90._0_8_ + -6755399441055744.0;
      auVar59 = auVar12;
    }
    else {
      auVar90 = vblendvpd_avx(ZEXT816(0x4330000000000000),ZEXT816(0x3ff0000000000000),auVar9);
      auVar68._0_8_ = auVar90._0_8_ * dVar33;
      auVar68._8_8_ = auVar90._8_8_ * dVar47;
      auVar58._8_8_ = 0xc04a000000000000;
      auVar58._0_8_ = 0xc04a000000000000;
      auVar90 = vandnpd_avx(auVar9,auVar58);
      auVar59._8_8_ = dVar47;
      auVar59._0_8_ = auVar68._0_8_;
      auVar9 = vpsrlq_avx(auVar68,0x34);
      auVar76._8_8_ = 0x4337fffffffffc01;
      auVar76._0_8_ = 0x4337fffffffffc01;
      auVar9 = vpaddq_avx(auVar9,auVar76);
      dVar48 = auVar90._0_8_ + auVar9._0_8_ + -6755399441055744.0;
    }
    auVar69._8_8_ = 0xfffffffffffff;
    auVar69._0_8_ = 0xfffffffffffff;
    auVar90 = vandps_avx(auVar59,auVar69);
    auVar70._8_8_ = 0x3fe0000000000000;
    auVar70._0_8_ = 0x3fe0000000000000;
    auVar9 = vorps_avx(auVar90,auVar70);
    auVar71._8_8_ = 0x3fe6a09e667f3bcd;
    auVar71._0_8_ = 0x3fe6a09e667f3bcd;
    auVar90 = vcmppd_avx(auVar71,auVar9,1);
    dVar8 = 0.0;
    bVar7 = (auVar90 & (undefined1  [16])0x1) == (undefined1  [16])0x0;
    dVar49 = 0.0;
    if (bVar7) {
      dVar49 = auVar9._0_8_;
    }
    dVar49 = dVar49 + auVar9._0_8_;
    if (!bVar7) {
      dVar8 = 1.0;
    }
    dVar23 = dVar49 + -1.0;
    dVar24 = dVar23 * dVar23;
    auVar95._0_8_ =
         dVar23 * -0.24604261088172152 + 0.3274040414833277 +
         dVar24 * (dVar23 * -0.16440826988949675 + 0.19717056511718561);
    auVar95._8_8_ =
         dVar23 * -0.12732281415503188 + 0.14089176364079287 +
         dVar24 * (dVar23 * -0.0766482905246683 + 0.12052759639123857);
    auVar90 = vshufpd_avx(auVar95,auVar95,1);
    dVar48 = (dVar48 + dVar8) * 0.6931471805599453 +
             dVar23 * ((dVar24 + dVar49 * -0.12132034355964258) *
                       (auVar95._0_8_ + dVar24 * dVar24 * auVar90._0_8_) +
                       dVar23 * -0.4901290717342736 + 1.0397207708399179);
    auVar60._8_8_ = 0;
    auVar60._0_8_ = dVar48;
    auVar90 = vblendpd_avx(auVar60,_DAT_00191e40,2);
    auVar96._8_8_ = 0x7ff0000000000000;
    auVar96._0_8_ = 0x7ff0000000000000;
    auVar77._0_8_ = -(ulong)(dVar33 == INFINITY);
    auVar77._8_8_ = -(ulong)(dVar47 == INFINITY);
    auVar30 = ZEXT816(0);
    auVar9 = vcmppd_avx(auVar30,auVar10,1);
    auVar9 = vpandn_avx(auVar77,auVar9);
    auVar104._8_8_ = 0;
    auVar104._0_8_ = dVar24 * dVar24;
    auVar34 = vpcmpeqd_avx(auVar104,auVar104);
    if (((auVar34 & ~auVar9) >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
        SUB161(auVar34 & ~auVar9,0xf) < '\0') {
      auVar34 = vcmpsd_avx(auVar10,auVar30,0);
      auVar105._8_8_ = 0xfff0000000000000;
      auVar105._0_8_ = 0xfff0000000000000;
      auVar9 = vblendvpd_avx(auVar96,auVar105,auVar34);
      auVar34 = vorpd_avx(auVar34,auVar77);
      auVar9 = vblendvpd_avx(auVar10,auVar9,auVar34);
      auVar10 = vcmppd_avx(auVar10,auVar30,3);
      auVar10 = vorpd_avx(auVar10,auVar34);
      auVar34 = vpsrad_avx(auVar12,0xc);
      auVar34 = vpand_avx(auVar34,_DAT_00191df0);
      auVar13._8_8_ = auVar90._8_8_;
      auVar13._0_8_ = auVar34._0_8_ + dVar48;
      auVar90 = vblendvpd_avx(auVar13,auVar9,auVar10);
    }
    uVar1 = vmovlpd_avx(auVar90);
    *(undefined8 *)*pauVar5 = uVar1;
  }
  return;
}

Assistant:

FORCE_INLINE void AVXLn(const P_Type1& from, size_t size, P_Type2&& to) noexcept {
        AVX_FLOAT_MATH_FUNC_CALL((AVXCopy<false, I_OutAligned>), S_Ln, LN_PARAMS_COMMON_SIZE, LN_PARAMS_DOUBLE, LN_PARAMS_FLOAT, LN_PARAMS_APPROX);
    }